

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int mz_zip_reader_locate_file(mz_zip_archive *pZip,char *pName,char *pComment,mz_uint flags)

{
  byte bVar1;
  ushort uVar2;
  mz_uint mVar3;
  mz_zip_internal_state *pmVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  size_t sVar14;
  uint uVar15;
  uint uVar16;
  ulong __n;
  byte bVar17;
  ulong uVar18;
  byte *pbVar19;
  byte *pbVar20;
  int iVar21;
  ulong uVar22;
  byte *pbVar23;
  byte bVar24;
  ulong uVar25;
  int iVar26;
  void *__s2;
  bool bVar27;
  bool bVar28;
  int local_6c;
  
  iVar12 = -1;
  iVar7 = iVar12;
  if (((pZip != (mz_zip_archive *)0x0) &&
      (pmVar4 = pZip->m_pState, pName != (char *)0x0 && pmVar4 != (mz_zip_internal_state *)0x0)) &&
     (pZip->m_zip_mode == MZ_ZIP_MODE_READING)) {
    if ((pComment == (char *)0x0 && (flags & 0x300) == 0) &&
       ((pmVar4->m_sorted_central_dir_offsets).m_size != 0)) {
      pvVar5 = (pmVar4->m_sorted_central_dir_offsets).m_p;
      mVar3 = pZip->m_total_files;
      sVar8 = strlen(pName);
      iVar26 = mVar3 - 1;
      iVar12 = 0;
      uVar9 = 0xffffffff;
      do {
        if (iVar26 < iVar12) {
          return -1;
        }
        uVar15 = (uint)(iVar12 + iVar26) >> 1;
        uVar25 = (ulong)*(uint *)((long)pvVar5 + (ulong)uVar15 * 4);
        pvVar6 = (pmVar4->m_central_dir).m_p;
        uVar11 = (ulong)*(uint *)((long)(pmVar4->m_central_dir_offsets).m_p + uVar25 * 4);
        pbVar19 = (byte *)((long)pvVar6 + uVar11 + 0x2e);
        uVar2 = *(ushort *)((long)pvVar6 + uVar11 + 0x1c);
        uVar22 = (ulong)uVar2;
        if ((uint)sVar8 <= (uint)uVar2) {
          uVar22 = sVar8 & 0xffffffff;
        }
        pbVar20 = (byte *)((long)pvVar6 + uVar22 + uVar11 + 0x2e);
        pbVar23 = (byte *)pName;
        if ((int)uVar22 == 0) {
          iVar21 = 0;
        }
        else {
          do {
            bVar1 = *pbVar19;
            bVar24 = bVar1 + 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar24 = bVar1;
            }
            bVar1 = *pbVar23;
            bVar17 = bVar1 + 0x20;
            if (0x19 < (byte)(bVar1 + 0xbf)) {
              bVar17 = bVar1;
            }
            if (bVar24 != bVar17) break;
            pbVar19 = pbVar19 + 1;
            pbVar23 = pbVar23 + 1;
          } while (pbVar19 < pbVar20);
          iVar21 = (uint)bVar24 - (uint)bVar17;
        }
        if (pbVar19 == pbVar20) {
          iVar21 = (uint)uVar2 - (uint)sVar8;
        }
        iVar7 = iVar26;
        if (iVar21 != 0) {
          uVar25 = uVar9;
          iVar7 = uVar15 - 1;
          if (iVar21 < 0) {
            iVar12 = uVar15 + 1;
            iVar7 = iVar26;
          }
        }
        iVar26 = iVar7;
        iVar7 = (int)uVar25;
        uVar9 = uVar25;
      } while (iVar21 != 0);
    }
    else {
      sVar8 = strlen(pName);
      if (sVar8 < 0x10000) {
        if (pComment == (char *)0x0) {
          uVar9 = 0;
        }
        else {
          uVar9 = strlen(pComment);
        }
        if ((uVar9 < 0x10000) && (uVar15 = pZip->m_total_files, (ulong)uVar15 != 0)) {
          pvVar5 = (pmVar4->m_central_dir).m_p;
          pvVar6 = (pmVar4->m_central_dir_offsets).m_p;
          uVar25 = 0;
          do {
            uVar22 = (ulong)*(uint *)((long)pvVar6 + uVar25 * 4);
            uVar2 = *(ushort *)((long)pvVar5 + uVar22 + 0x1c);
            uVar11 = (ulong)uVar2;
            bVar28 = false;
            if (sVar8 <= uVar11) {
              __s2 = (void *)((long)pvVar5 + uVar22 + 0x2e);
              if (uVar9 != 0) {
                __n = (ulong)*(ushort *)((long)pvVar5 + uVar22 + 0x20);
                if (uVar9 == __n) {
                  uVar18 = (ulong)*(byte *)((long)pvVar5 + uVar22 + 0x1f) * 0x100;
                  uVar10 = (ulong)*(byte *)((long)pvVar5 + uVar22 + 0x1e);
                  if ((flags >> 8 & 1) == 0) {
                    if (__n == 0) {
                      bVar27 = false;
                    }
                    else {
                      lVar13 = 0;
                      do {
                        bVar1 = pComment[lVar13];
                        iVar7 = bVar1 + 0x20;
                        if (0x19 < (byte)(bVar1 + 0xbf)) {
                          iVar7 = (int)(char)bVar1;
                        }
                        bVar1 = *(byte *)((long)pvVar5 +
                                         lVar13 + uVar18 + uVar22 + uVar10 + uVar11 + 0x2e);
                        iVar26 = bVar1 + 0x20;
                        if (0x19 < (byte)(bVar1 + 0xbf)) {
                          iVar26 = (int)(char)bVar1;
                        }
                        bVar27 = iVar7 != iVar26;
                      } while ((!bVar27) &&
                              (bVar28 = __n - 1 != lVar13, lVar13 = lVar13 + 1, bVar28));
                    }
                  }
                  else {
                    iVar7 = bcmp(pComment,(void *)((long)__s2 + uVar11 + (uVar18 | uVar10)),__n);
                    bVar27 = iVar7 != 0;
                  }
                  bVar27 = (bool)(bVar27 ^ 1);
                }
                else {
                  bVar27 = false;
                }
                bVar28 = false;
                if (!bVar27) goto LAB_00194392;
              }
              if (((flags >> 9 & 1) != 0) && (uVar2 != 0)) {
                do {
                  uVar16 = *(byte *)((long)__s2 + (uVar11 - 1 & 0xffffffff)) - 0x2f;
                  if ((uVar16 < 0x2e) && ((0x200000000801U >> ((ulong)uVar16 & 0x3f) & 1) != 0))
                  goto LAB_001942f3;
                  bVar28 = 1 < (long)uVar11;
                  uVar11 = uVar11 - 1;
                } while (bVar28);
                uVar11 = 0;
LAB_001942f3:
                __s2 = (void *)((long)__s2 + (uVar11 & 0xffffffff));
                uVar11 = (ulong)((uint)uVar2 - (int)uVar11);
              }
              if (sVar8 == uVar11) {
                if ((flags >> 8 & 1) == 0) {
                  if (uVar11 != 0) {
                    sVar14 = 0;
                    do {
                      bVar1 = pName[sVar14];
                      iVar7 = bVar1 + 0x20;
                      if (0x19 < (byte)(bVar1 + 0xbf)) {
                        iVar7 = (int)(char)bVar1;
                      }
                      bVar1 = *(byte *)((long)__s2 + sVar14);
                      iVar26 = bVar1 + 0x20;
                      if (0x19 < (byte)(bVar1 + 0xbf)) {
                        iVar26 = (int)(char)bVar1;
                      }
                      if (iVar7 != iVar26) goto LAB_00194375;
                      sVar14 = sVar14 + 1;
                    } while (uVar11 != sVar14);
                  }
                }
                else {
                  iVar7 = bcmp(pName,__s2,uVar11);
                  if (iVar7 != 0) goto LAB_00194375;
                }
                bVar28 = true;
                local_6c = (int)uVar25;
              }
              else {
LAB_00194375:
                bVar28 = false;
              }
            }
LAB_00194392:
            iVar7 = local_6c;
          } while ((!bVar28) && (uVar25 = uVar25 + 1, iVar7 = iVar12, uVar25 != uVar15));
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int mz_zip_reader_locate_file(mz_zip_archive *pZip, const char *pName,
                              const char *pComment, mz_uint flags) {
  mz_uint file_index;
  size_t name_len, comment_len;
  if ((!pZip) || (!pZip->m_pState) || (!pName) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_READING))
    return -1;
  if (((flags & (MZ_ZIP_FLAG_IGNORE_PATH | MZ_ZIP_FLAG_CASE_SENSITIVE)) == 0) &&
      (!pComment) && (pZip->m_pState->m_sorted_central_dir_offsets.m_size))
    return mz_zip_reader_locate_file_binary_search(pZip, pName);
  name_len = strlen(pName);
  if (name_len > 0xFFFF)
    return -1;
  comment_len = pComment ? strlen(pComment) : 0;
  if (comment_len > 0xFFFF)
    return -1;
  for (file_index = 0; file_index < pZip->m_total_files; file_index++) {
    const mz_uint8 *pHeader =
        &MZ_ZIP_ARRAY_ELEMENT(
            &pZip->m_pState->m_central_dir, mz_uint8,
            MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets,
                                 mz_uint32, file_index));
    mz_uint filename_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    const char *pFilename =
        (const char *)pHeader + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE;
    if (filename_len < name_len)
      continue;
    if (comment_len) {
      mz_uint file_extra_len = MZ_READ_LE16(pHeader + MZ_ZIP_CDH_EXTRA_LEN_OFS),
              file_comment_len =
                  MZ_READ_LE16(pHeader + MZ_ZIP_CDH_COMMENT_LEN_OFS);
      const char *pFile_comment = pFilename + filename_len + file_extra_len;
      if ((file_comment_len != comment_len) ||
          (!mz_zip_reader_string_equal(pComment, pFile_comment,
                                       file_comment_len, flags)))
        continue;
    }
    if ((flags & MZ_ZIP_FLAG_IGNORE_PATH) && (filename_len)) {
      int ofs = filename_len - 1;
      do {
        if ((pFilename[ofs] == '/') || (pFilename[ofs] == '\\') ||
            (pFilename[ofs] == ':'))
          break;
      } while (--ofs >= 0);
      ofs++;
      pFilename += ofs;
      filename_len -= ofs;
    }
    if ((filename_len == name_len) &&
        (mz_zip_reader_string_equal(pName, pFilename, filename_len, flags)))
      return file_index;
  }
  return -1;
}